

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O3

void __thiscall
amrex::StateData::FillBoundary
          (StateData *this,FArrayBox *dest,Real time,Real *dx,RealBox *prob_domain,int dest_comp,
          int src_comp,int num_comp)

{
  Box *this_00;
  Box *b;
  IntVect *pIVar1;
  int iVar2;
  StateDescriptor *this_01;
  bool bVar3;
  int k;
  long lVar4;
  double *pdVar5;
  BCRec *pBVar6;
  BndryFunc *pBVar7;
  undefined4 uVar8;
  int iVar9;
  int *bxlo;
  int *dlo;
  undefined4 uVar10;
  int iVar11;
  int *bxhi;
  IntVect *pIVar12;
  pointer piVar13;
  int *dhi;
  int i;
  int iVar14;
  Real time_local;
  int local_ac;
  BCRec bcr;
  int aiStack_90 [2];
  Vector<int,_std::allocator<int>_> bcrs;
  Real xlo [3];
  
  this_00 = &this->domain;
  b = &(dest->super_BaseFab<double>).domain;
  time_local = time;
  bVar3 = Box::contains(this_00,b);
  if (!bVar3) {
    pIVar12 = &(dest->super_BaseFab<double>).domain.bigend;
    bcrs.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bcrs.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bcrs.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bcr.bc[0] = -0x29a;
    bcr.bc[1] = -0x29a;
    bcr.bc[2] = -0x29a;
    bcr.bc[3] = -0x29a;
    bcr.bc[4] = -0x29a;
    bcr.bc[5] = -0x29a;
    lVar4 = 0;
    do {
      *(double *)((long)xlo + lVar4 * 2) =
           (double)(*(int *)((long)(b->smallend).vect + lVar4) -
                   *(int *)((long)(this_00->smallend).vect + lVar4)) *
           *(double *)((long)dx + lVar4 * 2) + *(double *)((long)prob_domain->xlo + lVar4 * 2);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0xc);
    if (0 < num_comp) {
      pIVar1 = &(this->domain).bigend;
      iVar14 = 0;
      do {
        i = src_comp + iVar14;
        pdVar5 = BaseFab<double>::dataPtr(&dest->super_BaseFab<double>,dest_comp + iVar14);
        this_01 = this->desc;
        if ((this_01->m_primary).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [i] == 0) {
          pBVar6 = StateDescriptor::getBC(this_01,i);
          lVar4 = 0;
          do {
            uVar8 = 0;
            uVar10 = 0;
            if (*(int *)((long)(b->smallend).vect + lVar4) <=
                *(int *)((long)(this_00->smallend).vect + lVar4)) {
              uVar10 = *(undefined4 *)((long)pBVar6->bc + lVar4);
            }
            *(undefined4 *)((long)bcr.bc + lVar4) = uVar10;
            if (*(int *)((long)(this->domain).bigend.vect + lVar4) <=
                *(int *)((long)(dest->super_BaseFab<double>).domain.bigend.vect + lVar4)) {
              uVar8 = *(undefined4 *)((long)pBVar6->bc + lVar4 + 0xc);
            }
            *(undefined4 *)((long)bcr.bc + lVar4 + 0xc) = uVar8;
            lVar4 = lVar4 + 4;
          } while (lVar4 != 0xc);
          pBVar7 = StateDescriptor::bndryFill(this->desc,i);
          (*pBVar7->_vptr_BndryFunc[3])
                    (pBVar7,pdVar5,b,pIVar12,this_00,pIVar1,dx,xlo,&time_local,&bcr);
LAB_004cfc49:
          iVar14 = iVar14 + 1;
        }
        else {
          iVar2 = (this_01->m_groupsize).super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[i];
          if (num_comp < iVar2 + iVar14) {
            pBVar6 = StateDescriptor::getBC(this_01,i);
            lVar4 = 0;
            do {
              uVar8 = 0;
              uVar10 = 0;
              if (*(int *)((long)(b->smallend).vect + lVar4) <=
                  *(int *)((long)(this_00->smallend).vect + lVar4)) {
                uVar10 = *(undefined4 *)((long)pBVar6->bc + lVar4);
              }
              *(undefined4 *)((long)bcr.bc + lVar4) = uVar10;
              if (*(int *)((long)(this->domain).bigend.vect + lVar4) <=
                  *(int *)((long)(dest->super_BaseFab<double>).domain.bigend.vect + lVar4)) {
                uVar8 = *(undefined4 *)((long)pBVar6->bc + lVar4 + 0xc);
              }
              *(undefined4 *)((long)bcr.bc + lVar4 + 0xc) = uVar8;
              lVar4 = lVar4 + 4;
            } while (lVar4 != 0xc);
            pBVar7 = StateDescriptor::bndryFill(this->desc,i);
            (*pBVar7->_vptr_BndryFunc[3])
                      (pBVar7,pdVar5,b,pIVar12,this_00,pIVar1,dx,xlo,&time_local,&bcr);
            goto LAB_004cfc49;
          }
          local_ac = iVar2 + iVar14;
          std::vector<int,_std::allocator<int>_>::resize
                    (&bcrs.super_vector<int,_std::allocator<int>_>,(long)iVar2 * 6);
          if (0 < iVar2) {
            iVar14 = 0;
            piVar13 = bcrs.super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            do {
              pBVar6 = StateDescriptor::getBC(this->desc,i + iVar14);
              lVar4 = -3;
              do {
                iVar9 = 0;
                iVar11 = 0;
                if (pIVar12->vect[lVar4] <= pIVar1->vect[lVar4]) {
                  iVar11 = pBVar6->bc[lVar4 + 3];
                }
                bcr.bc[lVar4 + 3] = iVar11;
                if ((int)((IndexType *)(&(this->domain).bigend + 1))[lVar4].itype <=
                    (int)((IndexType *)(&(dest->super_BaseFab<double>).domain.bigend + 1))[lVar4].
                         itype) {
                  iVar9 = pBVar6[1].bc[lVar4];
                }
                aiStack_90[lVar4] = iVar9;
                lVar4 = lVar4 + 1;
              } while (lVar4 != 0);
              lVar4 = 0;
              do {
                piVar13[lVar4] = bcr.bc[lVar4];
                lVar4 = lVar4 + 1;
              } while (lVar4 != 6);
              piVar13 = piVar13 + 6;
              iVar14 = iVar14 + 1;
            } while (iVar14 != iVar2);
          }
          pBVar7 = StateDescriptor::bndryFill(this->desc,i);
          (*pBVar7->_vptr_BndryFunc[4])
                    (pBVar7,pdVar5,b,pIVar12,this_00,pIVar1,dx,xlo,&time_local,
                     bcrs.super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start,(long)iVar2);
          iVar14 = local_ac;
        }
      } while (iVar14 < num_comp);
      if (bcrs.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(bcrs.super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)bcrs.super_vector<int,_std::allocator<int>_>.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)bcrs.super_vector<int,_std::allocator<int>_>.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void
StateData::FillBoundary (FArrayBox&     dest,
                         Real           time,
                         const Real*    dx,
                         const RealBox& prob_domain,
                         int            dest_comp,
                         int            src_comp,
                         int            num_comp)
{
    BL_PROFILE("StateData::FillBoundary(dx)");
    BL_ASSERT(dest.box().ixType() == desc->getType());

    if (domain.contains(dest.box())) return;

    const Box& bx  = dest.box();
    const int* dlo = dest.loVect();
    const int* dhi = dest.hiVect();
    const int* plo = domain.loVect();
    const int* phi = domain.hiVect();

    Vector<int> bcrs;

    Real xlo[AMREX_SPACEDIM];
    BCRec bcr;
    const Real* problo = prob_domain.lo();

    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        xlo[i] = problo[i] + dx[i]*(dlo[i]-plo[i]);
    }
    for (int i = 0; i < num_comp; )
    {
        const int dc  = dest_comp+i;
        const int sc  = src_comp+i;
        Real*     dat = dest.dataPtr(dc);

        if (desc->primary(sc))
        {
            const int groupsize = desc->groupsize(sc);

            BL_ASSERT(groupsize != 0);

            if (groupsize+i <= num_comp)
            {
                //
                // Can do the whole group at once.
                //
                bcrs.resize(2*AMREX_SPACEDIM*groupsize);

                int* bci  = bcrs.dataPtr();

                for (int j = 0; j < groupsize; j++)
                {
                    amrex::setBC(bx,domain,desc->getBC(sc+j),bcr);

                    const int* bc = bcr.vect();

                    for (int k = 0; k < 2*AMREX_SPACEDIM; k++)
                        bci[k] = bc[k];

                    bci += 2*AMREX_SPACEDIM;
                }
                //
                // Use the "group" boundary fill routine.
                //
                desc->bndryFill(sc)(dat,dlo,dhi,plo,phi,dx,xlo,&time,bcrs.dataPtr(),groupsize);
                i += groupsize;
            }
            else
            {
                amrex::setBC(bx,domain,desc->getBC(sc),bcr);
                desc->bndryFill(sc)(dat,dlo,dhi,plo,phi,dx,xlo,&time,bcr.vect());
                i++;
            }
        }
        else
        {
            amrex::setBC(bx,domain,desc->getBC(sc),bcr);
            desc->bndryFill(sc)(dat,dlo,dhi,plo,phi,dx,xlo,&time,bcr.vect());
            i++;
        }
    }

#ifdef AMREX_USE_GPU
    // Add a streamSynchronize here in case the user code launched kernels
    // to handle the boundary fills.
    Gpu::streamSynchronize();
#endif
}